

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O0

void __thiscall
density_tests::
QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
::add_test_case(QueueGenericTester<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>
                *this,runtime_type *i_type,PutTestCase i_put_func,
               ReentrantPutTestCase i_reentrant_put_func,ConsumeTestCase i_consume_func,
               ReentrantConsumeTestCase i_reentrant_consume_func)

{
  __enable_if_t<is_constructible<value_type,_pair<runtime_type<>,_unsigned_long>_&&>::value,_pair<iterator,_bool>_>
  _Var1;
  size_type local_60;
  pair<density::runtime_type<>,_unsigned_long> local_58;
  _Node_iterator_base<std::pair<const_density::runtime_type<>,_unsigned_long>,_false> local_48;
  __enable_if_t<is_constructible<value_type,_pair<runtime_type<>,_unsigned_long>_&&>::value,_pair<iterator,_bool>_>
  result;
  ReentrantConsumeTestCase i_reentrant_consume_func_local;
  ConsumeTestCase i_consume_func_local;
  ReentrantPutTestCase i_reentrant_put_func_local;
  PutTestCase i_put_func_local;
  runtime_type *i_type_local;
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  *this_local;
  
  result._8_8_ = i_reentrant_consume_func;
  i_reentrant_consume_func_local = (ReentrantConsumeTestCase)i_consume_func;
  i_consume_func_local = (ConsumeTestCase)i_reentrant_put_func;
  i_reentrant_put_func_local = (ReentrantPutTestCase)i_put_func;
  i_put_func_local = (PutTestCase)i_type;
  i_type_local = (runtime_type *)this;
  local_60 = std::
             vector<bool_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
             ::size((vector<bool_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
                     *)(this + 0x40));
  local_58 = std::make_pair<density::runtime_type<>const&,unsigned_long>(i_type,&local_60);
  _Var1 = std::
          unordered_map<density::runtime_type<>,unsigned_long,std::hash<density::runtime_type<>>,std::equal_to<density::runtime_type<>>,std::allocator<std::pair<density::runtime_type<>const,unsigned_long>>>
          ::insert<std::pair<density::runtime_type<>,unsigned_long>>
                    ((unordered_map<density::runtime_type<>,unsigned_long,std::hash<density::runtime_type<>>,std::equal_to<density::runtime_type<>>,std::allocator<std::pair<density::runtime_type<>const,unsigned_long>>>
                      *)(this + 8),&local_58);
  local_48._M_cur =
       (__node_type *)
       _Var1.first.
       super__Node_iterator_base<std::pair<const_density::runtime_type<>,_unsigned_long>,_false>.
       _M_cur;
  result.first.
  super__Node_iterator_base<std::pair<const_density::runtime_type<>,_unsigned_long>,_false>._M_cur.
  _0_1_ = _Var1.second;
  if (((undefined1  [16])_Var1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    detail::assert_failed<>
              ("result.second",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h"
               ,0x48);
  }
  std::
  vector<bool_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
  ::push_back((vector<bool_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<bool_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
               *)(this + 0x40),(value_type *)&i_reentrant_put_func_local);
  std::
  vector<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::reentrant_put_transaction<void>_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::reentrant_put_transaction<void>_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
  ::push_back((vector<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::reentrant_put_transaction<void>_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&),_std::allocator<density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::reentrant_put_transaction<void>_(*)(density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_&,_density_tests::EasyRandom_&)>_>
               *)(this + 0x70),(value_type *)&i_consume_func_local);
  std::
  vector<void_(*)(const_density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::consume_operation_&),_std::allocator<void_(*)(const_density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::consume_operation_&)>_>
  ::push_back((vector<void_(*)(const_density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::consume_operation_&),_std::allocator<void_(*)(const_density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::consume_operation_&)>_>
               *)(this + 0x58),(value_type *)&i_reentrant_consume_func_local);
  std::
  vector<void_(*)(const_density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::reentrant_consume_operation_&),_std::allocator<void_(*)(const_density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::reentrant_consume_operation_&)>_>
  ::push_back((vector<void_(*)(const_density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::reentrant_consume_operation_&),_std::allocator<void_(*)(const_density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::reentrant_consume_operation_&)>_>
               *)(this + 0x88),(value_type *)&result.second);
  return;
}

Assistant:

void add_test_case(
          const typename QUEUE::runtime_type & i_type,
          PutTestCase                          i_put_func,
          ReentrantPutTestCase                 i_reentrant_put_func,
          ConsumeTestCase                      i_consume_func,
          ReentrantConsumeTestCase             i_reentrant_consume_func)
        {
            auto result = m_element_types.insert(std::make_pair(i_type, m_put_cases.size()));
            DENSITY_TEST_ASSERT(result.second);

            m_put_cases.push_back(i_put_func);
            m_reentrant_put_cases.push_back(i_reentrant_put_func);
            m_consume_cases.push_back(i_consume_func);
            m_reentrant_consume_cases.push_back(i_reentrant_consume_func);
        }